

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib526.c
# Opt level: O2

int test(char *URL)

{
  uint __i;
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  CURL *pCVar4;
  int *piVar5;
  undefined8 uVar6;
  char *pcVar7;
  int iVar8;
  long lVar9;
  timeval tVar10;
  undefined8 uStack_200;
  int maxfd;
  int running;
  timeval interval;
  CURL *curl [4];
  fd_set exc;
  fd_set wr;
  fd_set rd;
  
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    curl[lVar2] = (CURL *)0x0;
  }
  tv_test_start = tutil_tvnow();
  iVar1 = curl_global_init(3);
  uVar6 = _stderr;
  if (iVar1 != 0) {
    uVar3 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar6,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib526.c"
                  ,0x43,iVar1,uVar3);
    goto LAB_00102489;
  }
  lVar2 = 0;
  do {
    if (lVar2 == 4) {
      lVar2 = curl_multi_init();
      if (lVar2 == 0) {
        lVar2 = 0;
        curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib526.c"
                      ,0x4e);
        iVar1 = 0x7b;
        goto LAB_00102464;
      }
      iVar1 = curl_multi_add_handle(lVar2,curl[0]);
      uVar6 = _stderr;
      if (iVar1 == 0) {
        curl_mfprintf(_stderr,"Start at URL 0\n");
        iVar8 = 0;
        goto LAB_001024b8;
      }
      uVar3 = curl_multi_strerror(iVar1);
      pcVar7 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
      uStack_200 = 0x50;
      goto LAB_0010242e;
    }
    pCVar4 = (CURL *)curl_easy_init();
    curl[lVar2] = pCVar4;
    if (pCVar4 == (CURL *)0x0) {
      lVar2 = 0;
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib526.c"
                    ,0x47);
      iVar1 = 0x7c;
      goto LAB_00102464;
    }
    iVar1 = curl_easy_setopt(pCVar4,0x2712,URL);
    uVar6 = _stderr;
    if (iVar1 != 0) {
      uVar3 = curl_easy_strerror(iVar1);
      pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      lVar2 = 0;
      uStack_200 = 0x49;
      goto LAB_0010242e;
    }
    iVar1 = curl_easy_setopt(pCVar4,0x29,1);
    uVar6 = _stderr;
    lVar2 = lVar2 + 1;
  } while (iVar1 == 0);
  uVar3 = curl_easy_strerror(iVar1);
  pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
  lVar2 = 0;
  uStack_200 = 0x4b;
LAB_0010242e:
  curl_mfprintf(uVar6,pcVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib526.c"
                ,uStack_200,iVar1,uVar3);
  goto LAB_00102464;
  while( true ) {
    tVar10 = tutil_tvnow();
    lVar9 = tutil_tvdiff(tVar10,tv_test_start);
    if (60000 < lVar9) {
      uVar6 = 0x5e;
      goto LAB_001026f0;
    }
    if (running == 0) {
      if (2 < iVar8) {
        iVar1 = 0;
        goto LAB_00102464;
      }
      iVar8 = iVar8 + 1;
      curl_mfprintf(_stderr,"Advancing to URL %d\n",iVar8);
      curl_multi_remove_handle(lVar2,curl[0]);
      curl_easy_reset(curl[0]);
      iVar1 = curl_easy_setopt(curl[0],0x2712,URL);
      uVar6 = _stderr;
      if (iVar1 != 0) {
        uVar3 = curl_easy_strerror(iVar1);
        pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        uStack_200 = 0x71;
        goto LAB_0010242e;
      }
      iVar1 = curl_easy_setopt(curl[0],0x29,1);
      uVar6 = _stderr;
      if (iVar1 != 0) {
        uVar3 = curl_easy_strerror(iVar1);
        pcVar7 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        uStack_200 = 0x73;
        goto LAB_0010242e;
      }
      iVar1 = curl_multi_add_handle(lVar2,curl[0]);
      uVar6 = _stderr;
      if (iVar1 != 0) {
        uVar3 = curl_multi_strerror(iVar1);
        pcVar7 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
        uStack_200 = 0x76;
        goto LAB_0010242e;
      }
    }
    for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
      rd.__fds_bits[lVar9] = 0;
    }
    for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
      wr.__fds_bits[lVar9] = 0;
    }
    for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
      exc.__fds_bits[lVar9] = 0;
    }
    iVar1 = curl_multi_fdset(lVar2,&rd,&wr,&exc,&maxfd);
    uVar6 = _stderr;
    if (iVar1 != 0) {
      uVar3 = curl_multi_strerror(iVar1);
      pcVar7 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
      uStack_200 = 0x84;
      goto LAB_0010242e;
    }
    if (maxfd < -1) {
      pcVar7 = "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
      uVar6 = 0x84;
      goto LAB_00102749;
    }
    iVar1 = select_wrapper(maxfd + 1,&rd,&wr,&exc,&interval);
    if (iVar1 == -1) {
      piVar5 = __errno_location();
      uVar6 = _stderr;
      iVar1 = *piVar5;
      pcVar7 = strerror(iVar1);
      curl_mfprintf(uVar6,"%s:%d select() failed, with errno %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib526.c"
                    ,0x88,iVar1,pcVar7);
      iVar1 = 0x79;
      goto LAB_00102464;
    }
    tVar10 = tutil_tvnow();
    lVar9 = tutil_tvdiff(tVar10,tv_test_start);
    if (60000 < lVar9) break;
LAB_001024b8:
    maxfd = -99;
    interval.tv_sec = 1;
    interval.tv_usec = 0;
    iVar1 = curl_multi_perform(lVar2,&running);
    uVar6 = _stderr;
    if (iVar1 != 0) {
      uVar3 = curl_multi_strerror(iVar1);
      pcVar7 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
      uStack_200 = 0x5c;
      goto LAB_0010242e;
    }
    if (running < 0) {
      pcVar7 = 
      "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n";
      uVar6 = 0x5c;
LAB_00102749:
      curl_mfprintf(_stderr,pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib526.c"
                    ,uVar6);
      iVar1 = 0x7a;
      goto LAB_00102464;
    }
  }
  uVar6 = 0x8a;
LAB_001026f0:
  curl_mfprintf(_stderr,"%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib526.c"
                ,uVar6);
  iVar1 = 0x7d;
LAB_00102464:
  for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
    curl_easy_cleanup(curl[lVar9]);
  }
  curl_multi_cleanup(lVar2);
  curl_global_cleanup();
LAB_00102489:
  return iVar1;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURL *curl[NUM_HANDLES];
  int running;
  CURLM *m = NULL;
  int current = 0;
  int i;

  for(i = 0; i < NUM_HANDLES; i++)
    curl[i] = NULL;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  /* get NUM_HANDLES easy handles */
  for(i = 0; i < NUM_HANDLES; i++) {
    easy_init(curl[i]);
    /* specify target */
    easy_setopt(curl[i], CURLOPT_URL, URL);
    /* go verbose */
    easy_setopt(curl[i], CURLOPT_VERBOSE, 1L);
  }

  multi_init(m);

  multi_add_handle(m, curl[current]);

  fprintf(stderr, "Start at URL 0\n");

  for(;;) {
    struct timeval interval;
    fd_set rd, wr, exc;
    int maxfd = -99;

    interval.tv_sec = 1;
    interval.tv_usec = 0;

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running) {
#ifdef LIB527
      /* NOTE: this code does not remove the handle from the multi handle
         here, which would be the nice, sane and documented way of working.
         This however tests that the API survives this abuse gracefully. */
      curl_easy_cleanup(curl[current]);
      curl[current] = NULL;
#endif
      if(++current < NUM_HANDLES) {
        fprintf(stderr, "Advancing to URL %d\n", current);
#ifdef LIB532
        /* first remove the only handle we use */
        curl_multi_remove_handle(m, curl[0]);

        /* make us re-use the same handle all the time, and try resetting
           the handle first too */
        curl_easy_reset(curl[0]);
        easy_setopt(curl[0], CURLOPT_URL, URL);
        /* go verbose */
        easy_setopt(curl[0], CURLOPT_VERBOSE, 1L);

        /* re-add it */
        multi_add_handle(m, curl[0]);
#else
        multi_add_handle(m, curl[current]);
#endif
      }
      else {
        break; /* done */
      }
    }

    FD_ZERO(&rd);
    FD_ZERO(&wr);
    FD_ZERO(&exc);

    multi_fdset(m, &rd, &wr, &exc, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &rd, &wr, &exc, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

#if defined(LIB526)

  /* test 526 and 528 */
  /* proper cleanup sequence - type PB */

  for(i = 0; i < NUM_HANDLES; i++) {
    curl_multi_remove_handle(m, curl[i]);
    curl_easy_cleanup(curl[i]);
  }
  curl_multi_cleanup(m);
  curl_global_cleanup();

#elif defined(LIB527)

  /* test 527 */

  /* Upon non-failure test flow the easy's have already been cleanup'ed. In
     case there is a failure we arrive here with easy's that have not been
     cleanup'ed yet, in this case we have to cleanup them or otherwise these
     will be leaked, let's use undocumented cleanup sequence - type UB */

  if(res)
    for(i = 0; i < NUM_HANDLES; i++)
      curl_easy_cleanup(curl[i]);

  curl_multi_cleanup(m);
  curl_global_cleanup();

#elif defined(LIB532)

  /* test 532 */
  /* undocumented cleanup sequence - type UB */

  for(i = 0; i < NUM_HANDLES; i++)
    curl_easy_cleanup(curl[i]);
  curl_multi_cleanup(m);
  curl_global_cleanup();

#endif

  return res;
}